

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O2

bool __thiscall OpenMD::NPA::etaConverged(NPA *this)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = 0.0;
  for (lVar1 = -0x60; lVar1 != 0; lVar1 = lVar1 + 0x20) {
    dVar3 = *(double *)
             ((long)(this->vScale).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                    data_[1] + lVar1) -
            *(double *)
             ((long)(this->oldEta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                    data_[1] + lVar1);
    dVar2 = dVar2 + dVar3 * dVar3;
  }
  dVar2 = dVar2 / 3.0;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  return dVar2 <= (this->super_NPT).etaTolerance;
}

Assistant:

bool NPA::etaConverged() {
    int i;
    RealType diffEta, sumEta;

    sumEta = 0;
    for (i = 0; i < 3; i++) {
      sumEta += pow(prevEta(i, i) - eta(i, i), 2);
    }

    diffEta = sqrt(sumEta / 3.0);

    return (diffEta <= etaTolerance);
  }